

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O3

io_context_pool * coro_io::g_block_io_context_pool<coro_io::io_context_pool>(uint pool_size)

{
  bool bVar1;
  int iVar2;
  ulong extraout_RAX;
  _lambda_auto_1__1_ local_35;
  uint local_34;
  undefined8 *local_30;
  shared_ptr<coro_io::io_context_pool> local_28;
  
  if (g_block_io_context_pool<coro_io::io_context_pool>(unsigned_int)::_g_io_context_pool == '\0') {
    iVar2 = __cxa_guard_acquire(&g_block_io_context_pool<coro_io::io_context_pool>(unsigned_int)::
                                 _g_io_context_pool);
    if (iVar2 != 0) {
      g_block_io_context_pool<coro_io::io_context_pool>::_g_io_context_pool.
      super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<coro_io::io_context_pool,std::allocator<coro_io::io_context_pool>,unsigned_int&>
                (&g_block_io_context_pool<coro_io::io_context_pool>::_g_io_context_pool.
                  super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (io_context_pool **)
                 &g_block_io_context_pool<coro_io::io_context_pool>::_g_io_context_pool,
                 (allocator<coro_io::io_context_pool> *)&local_30,&local_34);
      __cxa_atexit(std::__shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,
                   &g_block_io_context_pool<coro_io::io_context_pool>::_g_io_context_pool,
                   &__dso_handle);
      __cxa_guard_release(&g_block_io_context_pool<coro_io::io_context_pool>(unsigned_int)::
                           _g_io_context_pool);
    }
  }
  if (g_block_io_context_pool<coro_io::io_context_pool>(unsigned_int)::run_helper == '\0') {
    g_block_io_context_pool<coro_io::io_context_pool>();
    if ((extraout_RAX & 1) == 0) {
      bVar1 = g_block_io_context_pool<coro_io::io_context_pool>(unsigned_int)::{lambda(auto:1)#1}::
              operator()(&local_35,&local_28);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*local_30 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*local_30);
      }
      g_block_io_context_pool<coro_io::io_context_pool>::run_helper = bVar1;
      __cxa_guard_release(&g_block_io_context_pool<coro_io::io_context_pool>(unsigned_int)::
                           run_helper);
    }
  }
  return g_block_io_context_pool<coro_io::io_context_pool>::_g_io_context_pool.
         super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
}

Assistant:

inline T &g_block_io_context_pool(
    unsigned pool_size = std::thread::hardware_concurrency()) {
  static auto _g_io_context_pool = std::make_shared<T>(pool_size);
  [[maybe_unused]] static bool run_helper = [](auto pool) {
    std::thread thrd{[pool] {
      pool->run();
    }};
    thrd.detach();
    return true;
  }(_g_io_context_pool);
  return *_g_io_context_pool;
}